

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<duckdb::hugeint_t,(char)46>
               (char *string_ptr,idx_t string_size,hugeint_t *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  int params_2;
  ulong uVar12;
  idx_t iVar13;
  string error;
  string local_d0;
  DecimalCastData<duckdb::hugeint_t> local_b0;
  uint local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  hugeint_t *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  params_2 = CONCAT31(in_register_00000089,scale);
  local_78 = result;
  hugeint_t::hugeint_t(&local_b0.result,0);
  uVar12 = (ulong)(uint)((int)CONCAT71(in_register_00000081,width) << 4);
  local_b0.digit_count = '\0';
  local_b0.decimal_count = '\0';
  local_b0.round_set = false;
  local_b0.should_round = false;
  local_b0.excessive_decimals = '\0';
  local_b0.exponent_type = NONE;
  local_b0.limit.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar12);
  local_b0.limit.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar12 + 8);
  local_b0.width = width;
  local_b0.scale = scale;
  if (string_size != 0) {
    uVar12 = 0;
    do {
      bVar3 = string_ptr[uVar12];
      if ((4 < bVar3 - 9) && (bVar3 != 0x20)) {
        if (bVar3 == 0x2d) {
          if (string_size - 1 != uVar12) {
            uVar5 = string_size - uVar12;
            uVar6 = 1;
            goto LAB_00d843f4;
          }
          DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(&local_b0)
          ;
          break;
        }
        if (bVar3 == 0x30 && string_size - 1 != uVar12) {
          bVar1 = string_ptr[uVar12 + 1];
          if (bVar1 < 0x62) {
            if ((bVar1 != 0x42) && (bVar1 != 0x58)) goto LAB_00d84495;
          }
          else if ((bVar1 != 0x62) && (bVar1 != 0x78)) goto LAB_00d84495;
          if ((string_size - uVar12) - 3 < 0xfffffffffffffffe) break;
        }
        else {
LAB_00d84495:
          uVar6 = string_size - uVar12;
          uVar9 = (ulong)(bVar3 == 0x2b);
          uVar5 = uVar9;
          if (uVar9 < uVar6) goto LAB_00d844b1;
        }
        DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(&local_b0);
        break;
      }
      uVar12 = uVar12 + 1;
    } while (string_size != uVar12);
    goto LAB_00d8452e;
  }
  local_88 = 0;
  uStack_84 = 0;
  uStack_80._0_4_ = 0;
  uStack_80._4_4_ = 0;
  string_size = 0;
  goto LAB_00d84596;
  while( true ) {
    if (string_ptr[uVar12 + 1 + uVar6] == '_') {
      if (((string_size - uVar6) - 2 == uVar12) ||
         (uVar6 = uVar6 + 2, 9 < (byte)(string_ptr[uVar12 + uVar6] - 0x30U))) goto LAB_00d8452e;
    }
    else {
      uVar6 = uVar6 + 1;
    }
    uVar8 = uVar6;
    if (uVar5 <= uVar6) break;
LAB_00d843f4:
    bVar3 = string_ptr[uVar12 + uVar6];
    if (9 < (byte)(bVar3 - 0x30)) {
      uVar9 = uVar6;
      if (bVar3 != 0x2e) goto LAB_00d847d7;
      uVar10 = uVar6 + 1;
      uVar9 = uVar10;
      goto joined_r0x00d84676;
    }
    bVar2 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_b0,bVar3 - 0x30);
    if (!bVar2) goto LAB_00d8452e;
    uVar8 = uVar5;
    if (~uVar6 + string_size == uVar12) break;
  }
LAB_00d84822:
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(&local_b0)
  ;
  if ((bVar2) && (1 < uVar8)) goto LAB_00d84954;
  goto LAB_00d8452e;
joined_r0x00d84676:
  uVar8 = uVar9;
  if (uVar5 <= uVar9) {
LAB_00d848b0:
    if ((1 < uVar6) || (uVar10 < uVar8)) goto LAB_00d84822;
    goto LAB_00d8452e;
  }
  bVar3 = string_ptr[uVar12 + uVar9];
  if (9 < (byte)(bVar3 - 0x30)) {
    if (uVar10 < uVar9 || 1 < uVar6) goto LAB_00d847d7;
    goto LAB_00d8452e;
  }
  bVar2 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,true,true>
                    (&local_b0,bVar3 - 0x30);
  if (!bVar2) goto LAB_00d8452e;
  uVar8 = uVar5;
  if (~uVar9 + string_size == uVar12) goto LAB_00d848b0;
  if (string_ptr[uVar12 + 1 + uVar9] == '_') {
    if (((string_size - uVar9) - 2 == uVar12) ||
       (uVar9 = uVar9 + 2, 9 < (byte)(string_ptr[uVar12 + uVar9] - 0x30U))) goto LAB_00d8452e;
  }
  else {
    uVar9 = uVar9 + 1;
  }
  goto joined_r0x00d84676;
LAB_00d847d7:
  uVar4 = (uint)bVar3;
  if (bVar3 < 0x20) {
    if (uVar4 - 9 < 5) {
LAB_00d847eb:
      uVar9 = uVar9 + 1;
      uVar8 = uVar9;
      if (uVar9 < uVar5) {
        do {
          if ((4 < (byte)string_ptr[uVar12 + uVar9] - 9) && (string_ptr[uVar12 + uVar9] != 0x20))
          goto LAB_00d8452e;
          uVar9 = uVar9 + 1;
          uVar8 = uVar5;
        } while (uVar5 != uVar9);
      }
      goto LAB_00d84822;
    }
  }
  else if ((bVar3 == 0x65) || (uVar4 == 0x45)) {
    if ((uVar9 != 1) && (uVar9 + 1 < uVar5)) {
      local_d0._M_dataplus._M_p._0_2_ = 0;
      pcVar11 = string_ptr + uVar12 + uVar9 + 1;
      iVar13 = ~uVar12 + (string_size - uVar9);
      if (*pcVar11 == '-') {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar11,iVar13,(IntegerCastData<short> *)&local_d0,false);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar11,iVar13,(IntegerCastData<short> *)&local_d0,false);
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::
                HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                          (&local_b0,(int)(short)local_d0._M_dataplus._M_p);
        goto LAB_00d84a42;
      }
    }
  }
  else if (uVar4 == 0x20) goto LAB_00d847eb;
  goto LAB_00d8452e;
joined_r0x00d84726:
  uVar7 = uVar10;
  if (uVar6 <= uVar10) {
LAB_00d849d2:
    if ((uVar9 < uVar5) || (uVar8 < uVar7)) goto LAB_00d84937;
    goto LAB_00d8452e;
  }
  bVar3 = string_ptr[uVar12 + uVar10];
  if (9 < (byte)(bVar3 - 0x30)) {
    if (uVar8 < uVar10 || uVar9 < uVar5) goto LAB_00d848ec;
    goto LAB_00d8452e;
  }
  bVar2 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,false,true>
                    (&local_b0,bVar3 - 0x30);
  if (!bVar2) goto LAB_00d8452e;
  uVar7 = uVar6;
  if (~uVar10 + string_size == uVar12) goto LAB_00d849d2;
  if (string_ptr[uVar12 + 1 + uVar10] == '_') {
    if (((string_size - uVar10) - 2 == uVar12) ||
       (uVar10 = uVar10 + 2, 9 < (byte)(string_ptr[uVar12 + uVar10] - 0x30U))) goto LAB_00d8452e;
  }
  else {
    uVar10 = uVar10 + 1;
  }
  goto joined_r0x00d84726;
LAB_00d848ec:
  uVar4 = (uint)bVar3;
  if (bVar3 < 0x20) {
    if (uVar4 - 9 < 5) {
LAB_00d84900:
      uVar10 = uVar10 + 1;
      uVar7 = uVar10;
      if (uVar10 < uVar6) {
        do {
          if ((4 < (byte)string_ptr[uVar12 + uVar10] - 9) && (string_ptr[uVar12 + uVar10] != 0x20))
          goto LAB_00d8452e;
          uVar10 = uVar10 + 1;
          uVar7 = uVar6;
        } while (uVar6 != uVar10);
      }
      goto LAB_00d84937;
    }
  }
  else if ((bVar3 == 0x65) || (uVar4 == 0x45)) {
    if ((uVar10 != uVar9) && (uVar10 + 1 < uVar6)) {
      local_d0._M_dataplus._M_p._0_2_ = 0;
      pcVar11 = string_ptr + uVar12 + uVar10 + 1;
      iVar13 = ~uVar12 + (string_size - uVar10);
      if (*pcVar11 == '-') {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar11,iVar13,(IntegerCastData<short> *)&local_d0,false);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar11,iVar13,(IntegerCastData<short> *)&local_d0,false);
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::
                HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                          (&local_b0,(int)(short)local_d0._M_dataplus._M_p);
LAB_00d84a42:
        if (bVar2 != false) goto LAB_00d84954;
      }
    }
  }
  else if (uVar4 == 0x20) goto LAB_00d84900;
  goto LAB_00d8452e;
  while( true ) {
    if (string_ptr[uVar12 + 1 + uVar5] == '_') {
      if (((string_size - uVar5) - 2 == uVar12) ||
         (uVar7 = uVar5 + 2, 9 < (byte)(string_ptr[uVar12 + uVar7] - 0x30U))) goto LAB_00d8452e;
    }
    else {
      uVar7 = uVar5 + 1;
    }
    uVar5 = uVar7;
    if (uVar6 <= uVar7) break;
LAB_00d844b1:
    bVar3 = string_ptr[uVar12 + uVar5];
    if (9 < (byte)(bVar3 - 0x30)) {
      uVar10 = uVar5;
      if (bVar3 != 0x2e) goto LAB_00d848ec;
      uVar8 = uVar5 + 1;
      uVar10 = uVar8;
      goto joined_r0x00d84726;
    }
    bVar2 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                      (&local_b0,bVar3 - 0x30);
    if (!bVar2) goto LAB_00d8452e;
    uVar7 = uVar6;
    if (~uVar5 + string_size == uVar12) break;
  }
LAB_00d84937:
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                    (&local_b0);
  if ((bVar2) && (uVar9 < uVar7)) {
LAB_00d84954:
    local_78->lower = local_b0.result.lower;
    local_78->upper = local_b0.result.upper;
    return true;
  }
LAB_00d8452e:
  local_88 = (uint)string_size;
  if (local_88 < 0xd) {
    uStack_80._4_4_ = 0;
    uStack_84 = 0;
    uStack_80._0_4_ = 0;
    if (local_88 == 0) {
      string_size = 0;
    }
    else {
      switchD_015de399::default(&uStack_84,string_ptr,(ulong)(local_88 & 0xf));
    }
LAB_00d84596:
    string_ptr = (char *)&uStack_84;
    uStack_80 = (char *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
  }
  else {
    uStack_84 = *(undefined4 *)string_ptr;
    uStack_80 = string_ptr;
  }
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,string_ptr,string_ptr + (string_size & 0xffffffff));
  StringUtil::Format<std::__cxx11::string,int,int>
            (&local_d0,(StringUtil *)local_70,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)width,
             (uint)scale,params_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  HandleCastError::AssignError(&local_d0,parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(local_d0._M_dataplus._M_p._2_6_,(short)local_d0._M_dataplus._M_p) !=
      &local_d0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT62(local_d0._M_dataplus._M_p._2_6_,(short)local_d0._M_dataplus._M_p));
  }
  return false;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}